

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_list.c
# Opt level: O0

int qc_staticlist_add_head(QcStaticList *staticList,int cell)

{
  undefined4 *puVar1;
  int *piVar2;
  _StaticCell *headCell;
  _StaticCell *curCell;
  int cell_local;
  QcStaticList *staticList_local;
  
  if (((staticList == (QcStaticList *)0x0) || (cell < 0)) || (staticList->limit <= cell)) {
    staticList_local._4_4_ = -1;
  }
  else {
    puVar1 = (undefined4 *)get_staticlist_cell(staticList,cell);
    staticList_local._4_4_ = cell;
    if (staticList->head == -99) {
      *puVar1 = 0xffffff9d;
      puVar1[1] = 0xffffff9d;
      staticList->head = cell;
      staticList->tail = cell;
      staticList->num = 1;
    }
    else {
      piVar2 = (int *)get_staticlist_cell(staticList,staticList->head);
      *puVar1 = 0xffffff9d;
      puVar1[1] = staticList->head;
      *piVar2 = cell;
      staticList->head = cell;
      staticList->num = staticList->num + 1;
    }
  }
  return staticList_local._4_4_;
}

Assistant:

int qc_staticlist_add_head(QcStaticList *staticList, int cell)
{
    _StaticCell *curCell, *headCell;

    if(NULL == staticList || cell<0 || cell>=staticList->limit)
        return -1;

    curCell = get_staticlist_cell(staticList, cell);
    if(staticList->head == QC_INVALID_INT)
    {
        curCell->previous  = QC_INVALID_INT;
        curCell->next = QC_INVALID_INT;
        staticList->head = cell;
        staticList->tail = cell;
        staticList->num = 1;
    }
    else
    {
        headCell = get_staticlist_cell(staticList, staticList->head);
        
        curCell->previous  = QC_INVALID_INT;
        curCell->next = staticList->head;
        
        headCell->previous = cell;
        staticList->head = cell;
        staticList->num ++;
    }

    return cell;
}